

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMaxUp
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *param_3,bool updateOverlaps)

{
  Edge *pEVar1;
  Handle *pHVar2;
  Handle *pHVar3;
  short *psVar4;
  ushort uVar5;
  Handle *pHVar6;
  cbtOverlappingPairCallback *pcVar7;
  ushort uVar8;
  ulong uVar9;
  undefined6 in_register_00000012;
  long lVar10;
  unsigned_short *puVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  
  lVar14 = (long)axis;
  uVar9 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar8 = this->m_pEdges[lVar14][uVar9 + 1].m_handle;
  if (uVar8 != 0) {
    puVar11 = &this->m_pEdges[lVar14][uVar9].m_handle;
    uVar5 = *puVar11;
    pHVar6 = this->m_pHandles;
    uVar12 = 1 << (axis & 0x1fU) & 3;
    uVar13 = 1 << uVar12 & 3;
    do {
      if (((Edge *)(puVar11 + -1))->m_pos < puVar11[1]) {
        return;
      }
      pHVar2 = this->m_pHandles + uVar8;
      bVar15 = (puVar11[1] & 1) == 0;
      lVar10 = 0x3a;
      if (bVar15) {
        lVar10 = 0x34;
      }
      if ((((bVar15 && updateOverlaps) &&
           (lVar10 = 0x34,
           *(ushort *)
            ((long)(&(pHVar2->super_cbtBroadphaseProxy).m_aabbMax + 1) + (ulong)(uVar12 * 2)) <=
           *(ushort *)((long)pHVar6->m_maxEdges + (ulong)(uVar12 * 2) + (ulong)((uint)uVar5 * 0x48))
           )) && (*(ushort *)
                   ((long)(&(pHVar6->super_cbtBroadphaseProxy).m_aabbMax + 1) +
                   (ulong)(uVar12 * 2) + (ulong)((uint)uVar5 * 0x48)) <=
                  *(ushort *)((long)pHVar2->m_maxEdges + (ulong)(uVar12 * 2)))) &&
         ((uVar9 = (ulong)(uVar13 * 2),
          *(ushort *)((long)(&(pHVar2->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar9) <=
          *(ushort *)((long)pHVar6->m_maxEdges + uVar9 + (uint)uVar5 * 0x48) &&
          (uVar9 = (ulong)(uVar13 * 2),
          *(ushort *)
           ((long)(&(pHVar6->super_cbtBroadphaseProxy).m_aabbMax + 1) + uVar9 + (uint)uVar5 * 0x48)
          <= *(ushort *)((long)pHVar2->m_maxEdges + uVar9))))) {
        pHVar3 = this->m_pHandles + *puVar11;
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar3,pHVar2);
        pcVar7 = this->m_userPairCallback;
        if (pcVar7 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar7->_vptr_cbtOverlappingPairCallback[2])(pcVar7,pHVar3,pHVar2);
        }
      }
      psVar4 = (short *)((long)(pHVar2->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                        lVar14 * 2 + lVar10 + -0x14);
      *psVar4 = *psVar4 + -1;
      psVar4 = (short *)((long)pHVar6->m_maxEdges + lVar14 * 2 + (ulong)((uint)uVar5 * 0x48));
      *psVar4 = *psVar4 + 1;
      pEVar1 = (Edge *)(puVar11 + -1);
      *(ulong *)pEVar1 = *(ulong *)pEVar1 << 0x20 | *(ulong *)pEVar1 >> 0x20;
      uVar8 = puVar11[4];
      puVar11 = puVar11 + 2;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1 << axis) & 3;
		const int axis2 = (1 << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext, axis1, axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0, handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0, handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
}